

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O0

void __thiscall
front::symbol::FunctionSymbol::FunctionSymbol
          (FunctionSymbol *this,string *name,SymbolKind ret,int layerNum)

{
  int iVar1;
  undefined4 in_EDX;
  string *in_RSI;
  undefined8 *in_RDI;
  string *this_00;
  string *in_stack_ffffffffffffffb8;
  Symbol *in_stack_ffffffffffffffc0;
  string local_38 [36];
  undefined4 local_14;
  
  this_00 = local_38;
  local_14 = in_EDX;
  std::__cxx11::string::string(this_00,in_RSI);
  Symbol::Symbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(int)((ulong)this_00 >> 0x20));
  std::__cxx11::string::~string(local_38);
  *in_RDI = &PTR_kind_0036fae0;
  *(undefined4 *)(in_RDI + 6) = local_14;
  std::
  vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ::vector((vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
            *)0x2b0bfe);
  iVar1 = Symbol::symbolId + 1;
  *(int *)((long)in_RDI + 0x2c) = Symbol::symbolId;
  Symbol::symbolId = iVar1;
  return;
}

Assistant:

FunctionSymbol(string name, SymbolKind ret, int layerNum = 0)
      : _ret(ret), Symbol(name, layerNum) {
    id = Symbol::symbolId++;
  }